

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  int iVar1;
  undefined4 extraout_var;
  
  WriteTag(field_number,WIRETYPE_START_GROUP,output);
  iVar1 = (*value->_vptr_MessageLite[0xb])(value,output->cur_,output);
  output->cur_ = (uint8_t *)CONCAT44(extraout_var,iVar1);
  WriteTag(field_number,WIRETYPE_END_GROUP,output);
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}